

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

uint64_t __thiscall mkvmuxer::CuePoint::PayloadSize(CuePoint *this)

{
  uint64 uVar1;
  uint64 uVar2;
  uint64 uVar3;
  
  uVar1 = EbmlElementSize(0xf1,this->cluster_pos_);
  uVar2 = EbmlElementSize(0xf7,this->track_);
  uVar2 = uVar2 + uVar1;
  if ((this->output_block_number_ == true) && (1 < this->block_number_)) {
    uVar1 = EbmlElementSize(0x5378,this->block_number_);
    uVar2 = uVar2 + uVar1;
  }
  uVar1 = EbmlMasterElementSize(0xb7,uVar2);
  uVar3 = EbmlElementSize(0xb3,this->time_);
  return uVar3 + uVar2 + uVar1;
}

Assistant:

uint64_t CuePoint::PayloadSize() const {
  uint64_t size = EbmlElementSize(libwebm::kMkvCueClusterPosition,
                                  static_cast<uint64>(cluster_pos_));
  size += EbmlElementSize(libwebm::kMkvCueTrack, static_cast<uint64>(track_));
  if (output_block_number_ && block_number_ > 1)
    size += EbmlElementSize(libwebm::kMkvCueBlockNumber,
                            static_cast<uint64>(block_number_));
  const uint64_t track_pos_size =
      EbmlMasterElementSize(libwebm::kMkvCueTrackPositions, size) + size;
  const uint64_t payload_size =
      EbmlElementSize(libwebm::kMkvCueTime, static_cast<uint64>(time_)) +
      track_pos_size;

  return payload_size;
}